

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O3

void __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::
get_match_positions_basename_word_prefix
          (Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *posns)

{
  bool bVar1;
  char *pcVar2;
  pointer pcVar3;
  iterator __position;
  bool *pbVar4;
  char *pcVar5;
  pointer p_Var6;
  unsigned_long uVar7;
  char *pcVar8;
  unsigned_long local_38;
  
  pcVar8 = (this->item_basename_)._M_current;
  pcVar2 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar2 != pcVar8) {
    pcVar3 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var6 = (this->qit_basename_words_).
             super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar5 = (this->qit_basename_)._M_current;
    uVar7 = (long)pcVar8 - (long)pcVar3;
    pbVar4 = &(this->props_).
              super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)pcVar8 - (long)pcVar3].word_start;
    do {
      bVar1 = *pbVar4;
      if ((pcVar5 != p_Var6[bVar1]._M_current) && (*pcVar8 == *pcVar5)) {
        __position._M_current =
             (posns->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (posns->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_38 = uVar7;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>(posns,__position,&local_38);
        }
        else {
          *__position._M_current = uVar7;
          (posns->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        pcVar5 = pcVar5 + 1;
      }
      p_Var6 = p_Var6 + bVar1;
      pcVar8 = pcVar8 + 1;
      uVar7 = uVar7 + 1;
      pbVar4 = pbVar4 + 3;
    } while (pcVar8 != pcVar2);
  }
  return;
}

Assistant:

void get_match_positions_basename_word_prefix(
      std::vector<std::size_t>& posns) const {
    auto item_it = item_basename_;
    auto const item_first = item_.cbegin();
    auto const item_last = item_.cend();
    auto props_it = props_.cbegin() + (item_basename_ - item_.cbegin());
    auto query_it = qit_basename_;
    auto query_last_it = qit_basename_words_.cbegin();

    while (item_it != item_last) {
      if (props_it->word_start) {
        ++query_last_it;
      }
      if (query_it != *query_last_it && *item_it == *query_it) {
        ++query_it;
        posns.push_back(item_it - item_first);
      }
      ++item_it;
      ++props_it;
    }
  }